

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.cpp
# Opt level: O3

void __thiscall
CodeGenWorkItem::CodeGenWorkItem
          (CodeGenWorkItem *this,JobManager *manager,FunctionBody *functionBody,
          EntryPointInfo *entryPointInfo,bool isJitInDebugMode,CodeGenWorkItemType type)

{
  JsUtil::Job::Job(&this->super_Job,manager,false);
  this->_vptr_CodeGenWorkItem = (_func_int **)&PTR___cxa_pure_virtual_014d4d18;
  this->functionBody = functionBody;
  this->entryPointInfo = entryPointInfo;
  this->recyclableData = (CodeGenRecyclableData *)0x0;
  this->isInJitQueue = false;
  this->isAllocationCommitted = false;
  this->queuedFullJitWorkItem = (QueuedFullJitWorkItem *)0x0;
  this->allocation =
       (EmitBufferAllocation<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *)
       0x0;
  (this->jitData).hasSharedPropGuards = '\0';
  (this->jitData).isJitInDebugMode = '\0';
  (this->jitData).type = '\0';
  (this->jitData).jitMode = '\0';
  (this->jitData).profiledIterations = 0;
  (this->jitData).struct_pad_0 = 0;
  (this->jitData).loopNumber = 0;
  (this->jitData).inlineeInfoCount = 0;
  (this->jitData).symIdToValueTypeMapCount = 0;
  (this->jitData).struct_pad_1 = 0;
  (this->jitData).selfInfo = (PolymorphicInlineCacheInfoIDL *)0x0;
  (this->jitData).inlineeInfo = (PolymorphicInlineCacheInfoIDL *)0x0;
  (this->jitData).symIdToValueTypeMap = (unsigned_short *)0x0;
  (this->jitData).jitData = (FunctionJITTimeDataIDL *)0x0;
  (this->jitData).jittedLoopIterationsSinceLastBailoutAddr = 0;
  (this->jitData).functionBodyAddr = 0;
  (this->jitData).globalThisAddr = 0;
  (this->jitData).nativeDataAddr = 0;
  (this->jitData).startTime = 0;
  (this->jitData).type = type;
  (this->jitData).isJitInDebugMode = isJitInDebugMode;
  (this->jitData).jitMode = '\0';
  return;
}

Assistant:

CodeGenWorkItem::CodeGenWorkItem(
    JsUtil::JobManager *const manager,
    Js::FunctionBody *const functionBody,
    Js::EntryPointInfo* entryPointInfo,
    bool isJitInDebugMode,
    CodeGenWorkItemType type)
    : JsUtil::Job(manager)
    , functionBody(functionBody)
    , entryPointInfo(entryPointInfo)
    , recyclableData(nullptr)
    , isInJitQueue(false)
    , isAllocationCommitted(false)
    , queuedFullJitWorkItem(nullptr)
    , allocation(nullptr)
#ifdef IR_VIEWER
    , isRejitIRViewerFunction(false)
    , irViewerOutput(nullptr)
    , irViewerRequestContext(nullptr)
#endif
{
    this->jitData = {0};
    // work item data
    this->jitData.type = type;
    this->jitData.isJitInDebugMode = isJitInDebugMode;
    ResetJitMode();
}